

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O3

void Psr_ManPrintModules(Psr_Man_t *p)

{
  char *pcVar1;
  long lVar2;
  
  printf("Succeeded parsing %d models:\n",(ulong)(uint)(p->vSucceeded).nSize);
  if (0 < (p->vSucceeded).nSize) {
    lVar2 = 0;
    do {
      pcVar1 = Abc_NamStr(p->pStrs,(p->vSucceeded).pArray[lVar2]);
      if (pcVar1 == (char *)0x0) break;
      printf(" %s",pcVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (p->vSucceeded).nSize);
  }
  putchar(10);
  printf("Skipped %d known models:\n",(ulong)(uint)(p->vKnown).nSize);
  if (0 < (p->vKnown).nSize) {
    lVar2 = 0;
    do {
      pcVar1 = Abc_NamStr(p->pStrs,(p->vKnown).pArray[lVar2]);
      if (pcVar1 == (char *)0x0) break;
      printf(" %s",pcVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (p->vKnown).nSize);
  }
  putchar(10);
  printf("Skipped %d failed models:\n",(ulong)(uint)(p->vFailed).nSize);
  if (0 < (p->vFailed).nSize) {
    lVar2 = 0;
    do {
      pcVar1 = Abc_NamStr(p->pStrs,(p->vFailed).pArray[lVar2]);
      if (pcVar1 == (char *)0x0) break;
      printf(" %s",pcVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (p->vFailed).nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Psr_ManPrintModules( Psr_Man_t * p )
{
    char * pName; int i; 
    printf( "Succeeded parsing %d models:\n", Vec_IntSize(&p->vSucceeded) );
    Psr_ManForEachNameVec( &p->vSucceeded, p, pName, i )
        printf( " %s", pName );
    printf( "\n" );
    printf( "Skipped %d known models:\n", Vec_IntSize(&p->vKnown) );
    Psr_ManForEachNameVec( &p->vKnown, p, pName, i )
        printf( " %s", pName );
    printf( "\n" );
    printf( "Skipped %d failed models:\n", Vec_IntSize(&p->vFailed) );
    Psr_ManForEachNameVec( &p->vFailed, p, pName, i )
        printf( " %s", pName );
    printf( "\n" );
}